

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btSoftBodyInternals.h
# Opt level: O2

void __thiscall
btSoftColliders::CollideVF_SS::Process(CollideVF_SS *this,btDbvtNode *lnode,btDbvtNode *lface)

{
  btVector3 *v1;
  btVector3 *v1_00;
  btVector3 *v1_01;
  btDbvtNode *pbVar1;
  btDbvtNode *pbVar2;
  long lVar3;
  long lVar4;
  undefined1 auVar5 [16];
  undefined8 uVar6;
  undefined8 uVar7;
  btScalar bVar8;
  float fVar9;
  undefined4 extraout_XMM0_Db;
  undefined4 extraout_XMM0_Db_00;
  undefined4 extraout_XMM0_Dc;
  undefined4 extraout_XMM0_Dc_00;
  undefined4 extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  undefined4 extraout_XMM0_Dc_03;
  btScalar extraout_XMM0_Dd;
  btScalar extraout_XMM0_Dd_00;
  undefined4 extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  undefined4 extraout_XMM0_Dd_03;
  undefined4 in_XMM1_Dc;
  undefined4 uVar10;
  undefined4 in_XMM1_Dd;
  undefined4 uVar11;
  undefined1 auVar12 [16];
  undefined1 auVar15 [16];
  float fVar16;
  float fVar17;
  float fVar18;
  btVector3 bVar19;
  btScalar d;
  btVector3 o;
  btScalar local_1bc;
  btScalar local_1b8 [4];
  btScalar local_1a8 [4];
  undefined1 local_198 [8];
  undefined4 uStack_190;
  undefined4 uStack_18c;
  undefined1 local_188 [8];
  float fStack_180;
  float fStack_17c;
  undefined1 local_178 [16];
  undefined1 local_168 [16];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  btVector3 local_138;
  btVector3 local_128;
  undefined1 local_118 [16];
  btVector3 local_108;
  btVector3 local_f0;
  btVector3 local_e0;
  btVector3 local_d0;
  undefined1 local_c0 [8];
  btDbvtNode *pbStack_b8;
  btScalar local_b0;
  btScalar bStack_ac;
  btScalar bStack_a8;
  btScalar bStack_a4;
  btVector3 local_a0;
  btScalar local_90;
  float local_8c;
  btScalar local_88 [2];
  btVector3 local_80;
  btVector3 local_70;
  btVector3 local_60;
  btVector3 local_50;
  btVector3 local_40;
  undefined1 auVar13 [16];
  undefined1 auVar14 [16];
  
  pbVar1 = (lnode->field_2).childs[0];
  pbVar2 = (lface->field_2).childs[0];
  local_108.m_floats._0_8_ = *(undefined8 *)(pbVar1->volume).mx.m_floats;
  local_108.m_floats._8_8_ = *(undefined8 *)((pbVar1->volume).mx.m_floats + 2);
  local_1bc = 3.4028235e+38;
  local_d0 = operator-((btVector3 *)(*(long *)(pbVar2->volume).mx.m_floats + 0x10),&local_108);
  local_1b8[2] = (btScalar)extraout_XMM0_Dc;
  local_1b8[0] = (btScalar)(int)local_d0.m_floats._0_8_;
  local_1b8[1] = (btScalar)(int)((ulong)local_d0.m_floats._0_8_ >> 0x20);
  local_1b8[3] = extraout_XMM0_Dd;
  local_148._8_4_ = in_XMM1_Dc;
  local_148._0_8_ = local_d0.m_floats._8_8_;
  local_148._12_4_ = in_XMM1_Dd;
  local_e0 = operator-((btVector3 *)(*(long *)((pbVar2->volume).mx.m_floats + 2) + 0x10),&local_108)
  ;
  local_1a8[2] = (btScalar)extraout_XMM0_Dc_00;
  local_1a8[0] = (btScalar)(int)local_e0.m_floats._0_8_;
  local_1a8[1] = (btScalar)(int)((ulong)local_e0.m_floats._0_8_ >> 0x20);
  local_1a8[3] = extraout_XMM0_Dd_00;
  local_158._8_4_ = in_XMM1_Dc;
  local_158._0_8_ = local_e0.m_floats._8_8_;
  local_158._12_4_ = in_XMM1_Dd;
  local_f0 = operator-(&(pbVar2->parent->volume).mx,&local_108);
  local_128.m_floats[1] = local_1a8[1] - local_1b8[1];
  local_128.m_floats[0] = local_1a8[0] - local_1b8[0];
  local_128.m_floats[2] = (float)local_158._0_4_ - (float)local_148._0_4_;
  local_128.m_floats[3] = 0.0;
  local_168._8_4_ = extraout_XMM0_Dc_01;
  local_168._0_8_ = local_f0.m_floats._0_8_;
  local_168._12_4_ = extraout_XMM0_Dd_01;
  local_118._8_4_ = in_XMM1_Dc;
  local_118._0_8_ = local_f0.m_floats._8_8_;
  local_118._12_4_ = in_XMM1_Dd;
  local_80.m_floats[1] = local_f0.m_floats[1] - local_1b8[1];
  local_80.m_floats[0] = local_f0.m_floats[0] - local_1b8[0];
  local_80.m_floats[2] = local_f0.m_floats[2] - (float)local_148._0_4_;
  local_80.m_floats[3] = 0.0;
  _local_c0 = btVector3::cross(&local_128,&local_80);
  bVar8 = btVector3::length2((btVector3 *)local_c0);
  if (1.1920929e-07 < bVar8) {
    uVar10 = 0;
    uVar11 = 0;
    if (bVar8 < 0.0) {
      fVar9 = sqrtf(bVar8);
    }
    else {
      fVar9 = SQRT(bVar8);
    }
    local_128.m_floats[0] = fVar9;
    bVar19 = operator/((btVector3 *)local_c0,local_128.m_floats);
    fVar9 = (float)local_148._0_4_ * bVar19.m_floats[2] +
            local_1b8[0] * bVar19.m_floats[0] + bVar19.m_floats[1] * local_1b8[1];
    if (fVar9 * fVar9 < 3.4028235e+38) {
      local_178._4_4_ = local_148._4_4_;
      local_178._0_4_ = fVar9 * fVar9;
      local_178._8_4_ = local_148._8_4_;
      local_178._12_4_ = local_148._12_4_;
      local_198._0_4_ = bVar19.m_floats[2] * fVar9;
      local_198._4_4_ = bVar19.m_floats[3];
      uStack_190 = uVar10;
      uStack_18c = uVar11;
      local_188._0_4_ = bVar19.m_floats[0] * fVar9;
      local_188._4_4_ = bVar19.m_floats[1] * fVar9;
      fStack_180 = extraout_XMM0_Dc_02 * fVar9;
      fStack_17c = extraout_XMM0_Dd_02 * fVar9;
      local_1b8[0] = local_1b8[0] - (float)local_188._0_4_;
      local_1b8[1] = local_1b8[1] - (float)local_188._4_4_;
      local_1b8[2] = (float)local_148._0_4_ - (float)local_198._0_4_;
      local_1b8[3] = 0.0;
      fVar9 = local_1a8[0] - (float)local_188._0_4_;
      fVar17 = local_1a8[1] - (float)local_188._4_4_;
      local_1a8[1] = fVar17;
      local_1a8[0] = fVar9;
      local_1a8[2] = (float)local_158._0_4_ - (float)local_198._0_4_;
      local_1a8[3] = 0.0;
      local_80.m_floats[1] = fVar17;
      local_80.m_floats[0] = fVar9;
      local_80.m_floats[2] = (float)local_158._0_4_ - (float)local_198._0_4_;
      local_80.m_floats[3] = 0.0;
      local_128.m_floats = local_1b8;
      bVar19 = btVector3::cross(&local_128,&local_80);
      if (0.0 < bVar19.m_floats[2] * pbStack_b8._0_4_ +
                (float)local_c0._0_4_ * bVar19.m_floats[0] +
                bVar19.m_floats[1] * (float)local_c0._4_4_) {
        local_40.m_floats[0] = local_1a8[0];
        local_40.m_floats[1] = local_1a8[1];
        local_40.m_floats[2] = local_1a8[2];
        local_40.m_floats[3] = local_1a8[3];
        local_1a8[0] = (float)local_168._0_4_ - (float)local_188._0_4_;
        local_1a8[1] = local_f0.m_floats[1] - (float)local_188._4_4_;
        local_1a8[2] = (float)local_118._0_4_ - (float)local_198._0_4_;
        local_1a8[3] = 0.0;
        local_50.m_floats = local_1a8;
        bVar19 = btVector3::cross(&local_40,&local_50);
        if (0.0 < bVar19.m_floats[2] * pbStack_b8._0_4_ +
                  (float)local_c0._0_4_ * bVar19.m_floats[0] +
                  bVar19.m_floats[1] * (float)local_c0._4_4_) {
          local_60.m_floats[0] = local_1a8[0];
          local_60.m_floats[1] = local_1a8[1];
          local_60.m_floats[2] = local_1a8[2];
          local_60.m_floats[3] = local_1a8[3];
          local_70.m_floats[0] = local_1b8[0];
          local_70.m_floats[1] = local_1b8[1];
          local_70.m_floats[2] = local_1b8[2];
          local_70.m_floats[3] = local_1b8[3];
          bVar19 = btVector3::cross(&local_60,&local_70);
          auVar5 = _local_188;
          if (0.0 < bVar19.m_floats[2] * pbStack_b8._0_4_ +
                    (float)local_c0._0_4_ * bVar19.m_floats[0] +
                    bVar19.m_floats[1] * (float)local_c0._4_4_) {
            local_138.m_floats[2] = (btScalar)local_198._0_4_;
            local_138.m_floats[0] = (btScalar)local_188._0_4_;
            local_138.m_floats[1] = (btScalar)local_188._4_4_;
            local_138.m_floats[3] = 0.0;
            local_1bc = (btScalar)local_178._0_4_;
            _local_188 = auVar5;
            goto LAB_001a7f81;
          }
        }
      }
      ProjectOrigin(&local_d0,&local_e0,&local_138,&local_1bc);
      ProjectOrigin(&local_e0,&local_f0,&local_138,&local_1bc);
      ProjectOrigin(&local_f0,&local_d0,&local_138,&local_1bc);
    }
  }
LAB_001a7f81:
  local_1b8[0] = this->mrg;
  _local_c0 = operator-(&local_108,(btVector3 *)&pbVar1->parent);
  bVar8 = btVector3::length((btVector3 *)local_c0);
  fVar9 = bVar8 + bVar8 + local_1b8[0];
  local_1a8[0] = fVar9;
  if (local_1bc < fVar9 * fVar9) {
    local_118._0_4_ = local_1bc;
    local_148._0_8_ = this;
    lVar3 = *(long *)(pbVar2->volume).mx.m_floats;
    local_188 = (undefined1  [8])lVar3;
    lVar4 = *(long *)((pbVar2->volume).mx.m_floats + 2);
    local_168._0_8_ = lVar4;
    v1 = (btVector3 *)(lVar3 + 0x10);
    v1_00 = (btVector3 *)(lVar4 + 0x10);
    local_178._0_8_ = pbVar2->parent;
    v1_01 = &(pbVar2->parent->volume).mx;
    local_158._0_8_ = pbVar1;
    local_f0.m_floats[1] = local_108.m_floats[1] + local_138.m_floats[1];
    local_f0.m_floats[0] = local_108.m_floats[0] + local_138.m_floats[0];
    local_f0.m_floats[2] = local_138.m_floats[2] + local_108.m_floats[2];
    local_f0.m_floats[3] = 0.0;
    local_128 = operator-(v1,&local_f0);
    local_80 = operator-(v1_00,&local_f0);
    _local_c0 = btVector3::cross(&local_128,&local_80);
    bVar8 = btVector3::length((btVector3 *)local_c0);
    local_198._0_4_ = bVar8;
    local_50 = operator-(v1_00,&local_f0);
    local_60 = operator-(v1_01,&local_f0);
    local_40 = btVector3::cross(&local_50,&local_60);
    local_1b8[0] = btVector3::length(&local_40);
    local_1b8[1] = (btScalar)extraout_XMM0_Db;
    local_1b8[2] = (btScalar)extraout_XMM0_Dc_03;
    local_1b8[3] = (btScalar)extraout_XMM0_Dd_03;
    local_d0 = operator-(v1_01,&local_f0);
    uVar6 = local_158._0_8_;
    local_e0 = operator-(v1,&local_f0);
    local_70 = btVector3::cross(&local_d0,&local_e0);
    bVar8 = btVector3::length(&local_70);
    local_1b8[2] = local_1b8[1];
    fVar9 = 1.0 / ((float)local_198._0_4_ + local_1b8[0] + bVar8);
    fVar17 = fVar9 * (float)local_198._0_4_;
    if (0.0 < *(float *)(local_168._0_8_ + 0x60) && 0.0 < *(float *)((long)local_188 + 0x60)) {
      fVar18 = (float)(-(uint)(0.0 < *(float *)(local_178._0_8_ + 0x60)) &
                      (uint)(*(float *)(local_178._0_8_ + 0x60) * fVar17 +
                            *(float *)((long)local_188 + 0x60) * local_1b8[0] * fVar9 +
                            *(float *)(local_168._0_8_ + 0x60) * bVar8 * fVar9));
    }
    else {
      fVar18 = 0.0;
    }
    fVar16 = *(float *)(uVar6 + 0x60) + fVar18;
    uVar7 = local_148._0_8_;
    if (0.0 < fVar16) {
      _local_198 = ZEXT416((uint)fVar16);
      _local_188 = ZEXT416((uint)fVar18);
      local_168 = ZEXT416((uint)*(float *)(uVar6 + 0x60));
      local_178 = ZEXT416((uint)fVar17);
      local_1b8[1] = bVar8 * fVar9;
      local_1b8[0] = local_1b8[0] * fVar9;
      local_1b8[3] = (btScalar)extraout_XMM0_Db_00;
      if ((float)local_118._0_4_ < 0.0) {
        fVar9 = sqrtf((float)local_118._0_4_);
      }
      else {
        fVar9 = SQRT((float)local_118._0_4_);
      }
      local_128.m_floats[0] = -fVar9;
      local_a0 = operator/(&local_138,local_128.m_floats);
      auVar5 = local_158;
      local_90 = local_1a8[0];
      pbStack_b8 = pbVar2;
      local_158._0_4_ = (undefined4)uVar6;
      local_158._4_4_ = SUB84(uVar6,4);
      local_c0._0_4_ = local_158._0_4_;
      local_c0._4_4_ = local_158._4_4_;
      bStack_a8 = local_178._0_4_;
      bStack_a4 = local_178._4_4_;
      local_b0 = local_1b8[0];
      bStack_ac = local_1b8[1];
      lVar3 = *(long *)(uVar7 + 8);
      lVar4 = *(long *)(uVar7 + 0x10);
      fVar9 = *(float *)(lVar4 + 0x194);
      local_8c = *(float *)(lVar3 + 0x194);
      if (*(float *)(lVar3 + 0x194) <= fVar9) {
        local_8c = fVar9;
      }
      auVar13._0_8_ = local_168._0_8_;
      auVar13._12_4_ = local_168._12_4_;
      auVar13._8_4_ = local_168._4_4_;
      auVar12._8_8_ = auVar13._8_8_;
      auVar12._0_4_ = local_168._0_4_;
      auVar12._4_4_ = local_188._0_4_;
      auVar14._0_12_ = auVar12._0_12_;
      auVar14._12_4_ = local_188._4_4_;
      auVar15._4_4_ = local_198._0_4_;
      auVar15._0_4_ = local_198._0_4_;
      auVar15._8_4_ = local_198._4_4_;
      auVar15._12_4_ = local_198._4_4_;
      auVar15 = divps(auVar14,auVar15);
      local_88[1] = *(float *)(lVar4 + 0x1a4) * auVar15._4_4_;
      local_88[0] = *(float *)(lVar3 + 0x1a4) * auVar15._0_4_;
      local_158 = auVar5;
      btAlignedObjectArray<btSoftBody::SContact>::push_back
                ((btAlignedObjectArray<btSoftBody::SContact> *)(lVar3 + 0x430),(SContact *)local_c0)
      ;
    }
  }
  return;
}

Assistant:

void		Process(const btDbvtNode* lnode,
			const btDbvtNode* lface)
		{
			btSoftBody::Node*	node=(btSoftBody::Node*)lnode->data;
			btSoftBody::Face*	face=(btSoftBody::Face*)lface->data;
			btVector3			o=node->m_x;
			btVector3			p;
			btScalar			d=SIMD_INFINITY;
			ProjectOrigin(	face->m_n[0]->m_x-o,
				face->m_n[1]->m_x-o,
				face->m_n[2]->m_x-o,
				p,d);
			const btScalar	m=mrg+(o-node->m_q).length()*2;
			if(d<(m*m))
			{
				const btSoftBody::Node*	n[]={face->m_n[0],face->m_n[1],face->m_n[2]};
				const btVector3			w=BaryCoord(n[0]->m_x,n[1]->m_x,n[2]->m_x,p+o);
				const btScalar			ma=node->m_im;
				btScalar				mb=BaryEval(n[0]->m_im,n[1]->m_im,n[2]->m_im,w);
				if(	(n[0]->m_im<=0)||
					(n[1]->m_im<=0)||
					(n[2]->m_im<=0))
				{
					mb=0;
				}
				const btScalar	ms=ma+mb;
				if(ms>0)
				{
					btSoftBody::SContact	c;
					c.m_normal		=	p/-btSqrt(d);
					c.m_margin		=	m;
					c.m_node		=	node;
					c.m_face		=	face;
					c.m_weights		=	w;
					c.m_friction	=	btMax(psb[0]->m_cfg.kDF,psb[1]->m_cfg.kDF);
					c.m_cfm[0]		=	ma/ms*psb[0]->m_cfg.kSHR;
					c.m_cfm[1]		=	mb/ms*psb[1]->m_cfg.kSHR;
					psb[0]->m_scontacts.push_back(c);
				}
			}	
		}